

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServer.cxx
# Opt level: O0

void __thiscall cmServer::cmServer(cmServer *this,cmConnection *conn,bool supportExperimental)

{
  cmServerProtocol1 *this_00;
  bool supportExperimental_local;
  cmConnection *conn_local;
  cmServer *this_local;
  
  cmServerBase::cmServerBase(&this->super_cmServerBase,conn);
  (this->super_cmServerBase)._vptr_cmServerBase = (_func_int **)&PTR__cmServer_00acd320;
  std::shared_ptr<cmFileMonitor>::shared_ptr(&this->fileMonitor);
  this->SupportExperimental = supportExperimental;
  this->Protocol = (cmServerProtocol *)0x0;
  std::vector<cmServerProtocol_*,_std::allocator<cmServerProtocol_*>_>::vector
            (&this->SupportedProtocols);
  this_00 = (cmServerProtocol1 *)operator_new(0xe0);
  cmServerProtocol1::cmServerProtocol1(this_00);
  RegisterProtocol(this,(cmServerProtocol *)this_00);
  return;
}

Assistant:

cmServer::cmServer(cmConnection* conn, bool supportExperimental)
  : cmServerBase(conn)
  , SupportExperimental(supportExperimental)
{
  // Register supported protocols:
  this->RegisterProtocol(new cmServerProtocol1);
}